

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

ssize_t write_data_block(archive_write_disk *a,char *buff,size_t size)

{
  wchar_t wVar1;
  long lVar2;
  __off_t _Var3;
  int *piVar4;
  ssize_t sVar5;
  int64_t block_end;
  char *end;
  char *p;
  size_t sStack_48;
  wchar_t r;
  ssize_t bytes_to_write;
  ssize_t block_size;
  ssize_t bytes_written;
  uint64_t start_size;
  size_t size_local;
  char *buff_local;
  archive_write_disk *a_local;
  
  bytes_to_write = 0;
  if (size == 0) {
    a_local = (archive_write_disk *)0x0;
  }
  else if ((a->filesize == 0) || (a->fd < L'\0')) {
    archive_set_error(&a->archive,0,"Attempt to write to an empty file");
    a_local = (archive_write_disk *)0xffffffffffffffec;
  }
  else {
    if ((a->flags & 0x1000U) != 0) {
      wVar1 = lazy_stat(a);
      if (wVar1 != L'\0') {
        return (long)wVar1;
      }
      bytes_to_write = a->pst->st_blksize;
    }
    start_size = size;
    size_local = (size_t)buff;
    if ((-1 < a->filesize) && (a->filesize < (long)(a->offset + size))) {
      start_size = a->filesize - a->offset;
      size = start_size;
    }
    while (start_size != 0) {
      if (bytes_to_write == 0) {
        sStack_48 = start_size;
      }
      else {
        for (end = (char *)size_local; (end < (char *)(size_local + start_size) && (*end == '\0'));
            end = end + 1) {
        }
        a->offset = (int64_t)(end + (a->offset - size_local));
        start_size = start_size - ((long)end - size_local);
        size_local = (size_t)end;
        if (start_size == 0) {
          start_size = 0;
          break;
        }
        lVar2 = (a->offset / bytes_to_write + 1) * bytes_to_write;
        sStack_48 = start_size;
        if (lVar2 < (long)(a->offset + start_size)) {
          sStack_48 = lVar2 - a->offset;
        }
      }
      if (a->offset != a->fd_offset) {
        _Var3 = lseek(a->fd,a->offset,0);
        if (_Var3 < 0) {
          piVar4 = __errno_location();
          archive_set_error(&a->archive,*piVar4,"Seek failed");
          return -0x1e;
        }
        a->fd_offset = a->offset;
      }
      sVar5 = write(a->fd,(void *)size_local,sStack_48);
      if (sVar5 < 0) {
        piVar4 = __errno_location();
        archive_set_error(&a->archive,*piVar4,"Write failed");
        return -0x14;
      }
      size_local = sVar5 + size_local;
      start_size = start_size - sVar5;
      a->total_bytes_written = sVar5 + a->total_bytes_written;
      a->offset = sVar5 + a->offset;
      a->fd_offset = a->offset;
    }
    a_local = (archive_write_disk *)(size - start_size);
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
write_data_block(struct archive_write_disk *a, const char *buff, size_t size)
{
	uint64_t start_size = size;
	ssize_t bytes_written = 0;
	ssize_t block_size = 0, bytes_to_write;

	if (size == 0)
		return (ARCHIVE_OK);

	if (a->filesize == 0 || a->fd < 0) {
		archive_set_error(&a->archive, 0,
		    "Attempt to write to an empty file");
		return (ARCHIVE_WARN);
	}

	if (a->flags & ARCHIVE_EXTRACT_SPARSE) {
#if HAVE_STRUCT_STAT_ST_BLKSIZE
		int r;
		if ((r = lazy_stat(a)) != ARCHIVE_OK)
			return (r);
		block_size = a->pst->st_blksize;
#else
		/* XXX TODO XXX Is there a more appropriate choice here ? */
		/* This needn't match the filesystem allocation size. */
		block_size = 16*1024;
#endif
	}

	/* If this write would run beyond the file size, truncate it. */
	if (a->filesize >= 0 && (int64_t)(a->offset + size) > a->filesize)
		start_size = size = (size_t)(a->filesize - a->offset);

	/* Write the data. */
	while (size > 0) {
		if (block_size == 0) {
			bytes_to_write = size;
		} else {
			/* We're sparsifying the file. */
			const char *p, *end;
			int64_t block_end;

			/* Skip leading zero bytes. */
			for (p = buff, end = buff + size; p < end; ++p) {
				if (*p != '\0')
					break;
			}
			a->offset += p - buff;
			size -= p - buff;
			buff = p;
			if (size == 0)
				break;

			/* Calculate next block boundary after offset. */
			block_end
			    = (a->offset / block_size + 1) * block_size;

			/* If the adjusted write would cross block boundary,
			 * truncate it to the block boundary. */
			bytes_to_write = size;
			if (a->offset + bytes_to_write > block_end)
				bytes_to_write = block_end - a->offset;
		}
		/* Seek if necessary to the specified offset. */
		if (a->offset != a->fd_offset) {
			if (lseek(a->fd, a->offset, SEEK_SET) < 0) {
				archive_set_error(&a->archive, errno,
				    "Seek failed");
				return (ARCHIVE_FATAL);
			}
			a->fd_offset = a->offset;
		}
		bytes_written = write(a->fd, buff, bytes_to_write);
		if (bytes_written < 0) {
			archive_set_error(&a->archive, errno, "Write failed");
			return (ARCHIVE_WARN);
		}
		buff += bytes_written;
		size -= bytes_written;
		a->total_bytes_written += bytes_written;
		a->offset += bytes_written;
		a->fd_offset = a->offset;
	}
	return (start_size - size);
}